

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitGlobalSet(FunctionValidator *this,GlobalSet *curr)

{
  bool bVar1;
  Global *pGVar2;
  
  if (this->info->validateGlobally == true) {
    pGVar2 = Module::getGlobalOrNull
                       ((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .currModule,(Name)(curr->name).super_IString.str);
    bVar1 = shouldBeTrue<wasm::GlobalSet*>
                      (this,pGVar2 != (Global *)0x0,curr,
                       "global.set name must be valid (and not an import; imports can\'t be modified)"
                      );
    if (bVar1) {
      shouldBeTrue<wasm::GlobalSet*>(this,pGVar2->mutable_,curr,"global.set global must be mutable")
      ;
      shouldBeSubType(this,(Type)(curr->value->type).id,(Type)(pGVar2->type).id,(Expression *)curr,
                      "global.set value must have right type");
      return;
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitGlobalSet(GlobalSet* curr) {
  if (!info.validateGlobally) {
    return;
  }
  auto* global = getModule()->getGlobalOrNull(curr->name);
  if (shouldBeTrue(global,
                   curr,
                   "global.set name must be valid (and not an import; imports "
                   "can't be modified)")) {
    shouldBeTrue(global->mutable_, curr, "global.set global must be mutable");
    shouldBeSubType(curr->value->type,
                    global->type,
                    curr,
                    "global.set value must have right type");
  }
}